

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipboard.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  GLFWwindow *handle;
  char *__ptr;
  size_t sStack_20;
  
  iVar1 = getopt(argc,argv,"h");
  if (iVar1 == -1) {
    glfwSetErrorCallback(error_callback);
    iVar1 = glfwInit();
    if (iVar1 == 0) {
      __ptr = "Failed to initialize GLFW\n";
      sStack_20 = 0x1a;
    }
    else {
      handle = glfwCreateWindow(200,200,"Clipboard Test",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
      if (handle != (GLFWwindow *)0x0) {
        glfwMakeContextCurrent(handle);
        gladLoadGLLoader(glfwGetProcAddress);
        glfwSwapInterval(1);
        glfwSetKeyCallback(handle,key_callback);
        glfwSetFramebufferSizeCallback(handle,framebuffer_size_callback);
        (*glad_glClearColor)(0.5,0.5,0.5,0.0);
        while( true ) {
          iVar1 = glfwWindowShouldClose(handle);
          if (iVar1 != 0) break;
          (*glad_glClear)(0x4000);
          glfwSwapBuffers(handle);
          glfwWaitEvents();
        }
        glfwTerminate();
        goto LAB_00110b7b;
      }
      glfwTerminate();
      __ptr = "Failed to open GLFW window\n";
      sStack_20 = 0x1b;
    }
    fwrite(__ptr,sStack_20,1,_stderr);
  }
  else {
    if (iVar1 == 0x68) {
      usage();
LAB_00110b7b:
      exit(0);
    }
    usage();
  }
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    int ch;
    GLFWwindow* window;

    while ((ch = getopt(argc, argv, "h")) != -1)
    {
        switch (ch)
        {
            case 'h':
                usage();
                exit(EXIT_SUCCESS);

            default:
                usage();
                exit(EXIT_FAILURE);
        }
    }

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
    {
        fprintf(stderr, "Failed to initialize GLFW\n");
        exit(EXIT_FAILURE);
    }

    window = glfwCreateWindow(200, 200, "Clipboard Test", NULL, NULL);
    if (!window)
    {
        glfwTerminate();

        fprintf(stderr, "Failed to open GLFW window\n");
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
    glfwSwapInterval(1);

    glfwSetKeyCallback(window, key_callback);
    glfwSetFramebufferSizeCallback(window, framebuffer_size_callback);

    glClearColor(0.5f, 0.5f, 0.5f, 0);

    while (!glfwWindowShouldClose(window))
    {
        glClear(GL_COLOR_BUFFER_BIT);

        glfwSwapBuffers(window);
        glfwWaitEvents();
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}